

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O1

LabelInstr * Peeps::RetargetBrToBr(BranchInstr *branchInstr,LabelInstr *targetInstr)

{
  Func **ppFVar1;
  char cVar2;
  OpCode OVar3;
  Opnd *pOVar4;
  LabelInstr *pLVar5;
  Instr *pIVar6;
  LabelInstr *pLVar7;
  code *pcVar8;
  bool bVar9;
  undefined4 *puVar10;
  Instr *instr;
  MultiBranchInstr *branchRef;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  LabelInstr *local_48;
  
  if (targetInstr == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x31b,"(targetInstr)","targetInstr");
    if (!bVar9) goto LAB_006265cb;
    *puVar10 = 0;
  }
  instr = IR::Instr::GetNextRealInstr(&targetInstr->super_Instr);
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x31d,"(targetInstrNext)","GetNextRealInstr() failed to get next target");
    if (!bVar9) {
LAB_006265cb:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar10 = 0;
  }
  if (MDStart < (branchInstr->super_Instr).m_opcode) {
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar14 = 0;
    local_48 = (LabelInstr *)0x0;
    do {
      if (instr->m_kind == InstrKindBranch) {
        if (instr->m_kind != InstrKindBranch) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
          if (!bVar9) goto LAB_006265cb;
          *puVar10 = 0;
        }
        OVar3 = instr->m_opcode;
        if (OVar3 < ADD) {
          bVar9 = OVar3 == MultiBr || OVar3 == Br;
        }
        else {
          bVar9 = LowererMD::IsUnconditionalBranch(instr);
        }
        if (bVar9 == false) {
          if (((instr->m_opcode == (branchInstr->super_Instr).m_opcode) &&
              ((((pOVar4 = (branchInstr->super_Instr).m_src1, pOVar4 != (Opnd *)0x0 &&
                 (instr->m_src1 != (Opnd *)0x0)) &&
                (bVar9 = IR::Opnd::IsEqual(pOVar4,instr->m_src1), bVar9)) ||
               (((branchInstr->super_Instr).m_src1 == (Opnd *)0x0 && (instr->m_src1 == (Opnd *)0x0))
               )))) && (((pOVar4 = (branchInstr->super_Instr).m_src2, pOVar4 != (Opnd *)0x0 &&
                         ((instr->m_src2 != (Opnd *)0x0 &&
                          (bVar9 = IR::Opnd::IsEqual(pOVar4,instr->m_src2), bVar9)))) ||
                        (((branchInstr->super_Instr).m_src2 == (Opnd *)0x0 &&
                         (instr->m_src2 == (Opnd *)0x0)))))) {
            bVar9 = true;
          }
          else {
            bVar9 = false;
          }
          if (bVar9) goto LAB_006261fb;
        }
        else {
LAB_006261fb:
          pLVar5 = local_48;
          if (((targetInstr->field_0x78 & 1) != 0) &&
             ((instr->m_opcode < ADD ||
              (((targetInstr->field_0x78 & 1) != 0 &&
               (pLVar5 = targetInstr, targetInstr == local_48)))))) goto LAB_0062626a;
          local_48 = pLVar5;
          pLVar5 = branchInstr->m_branchTarget;
          if (pLVar5 == (LabelInstr *)0x0) {
            if (branchInstr->m_isMultiBranch == false) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              uVar13 = 0x20e;
              pcVar12 = "(m_isMultiBranch)";
              pcVar11 = "m_isMultiBranch";
              goto LAB_006262b8;
            }
          }
          else if (branchInstr->m_isMultiBranch == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            uVar13 = 0x209;
            pcVar12 = "(!m_isMultiBranch)";
            pcVar11 = "!m_isMultiBranch";
LAB_006262b8:
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,uVar13,pcVar12,pcVar11);
            if (!bVar9) goto LAB_006265cb;
            *puVar10 = 0;
          }
          if ((pLVar5 != (LabelInstr *)0x0) &&
             ((branchInstr->m_branchTarget->field_0x78 & 0x20) != 0)) {
            pIVar6 = instr[1].m_next;
            cVar2 = *(char *)((long)&instr[1]._vptr_Instr + 1);
            if (pIVar6 == (Instr *)0x0) {
              if (cVar2 == '\0') {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar10 = 1;
                uVar13 = 0x20e;
                pcVar12 = "(m_isMultiBranch)";
                pcVar11 = "m_isMultiBranch";
                goto LAB_0062635d;
              }
            }
            else if (cVar2 != '\0') {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              uVar13 = 0x209;
              pcVar12 = "(!m_isMultiBranch)";
              pcVar11 = "!m_isMultiBranch";
LAB_0062635d:
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,uVar13,pcVar12,pcVar11);
              if (!bVar9) goto LAB_006265cb;
              *puVar10 = 0;
            }
            if (pIVar6 != (Instr *)0x0) {
              ppFVar1 = &instr[1].m_next[1].m_func;
              *(byte *)ppFVar1 = *(byte *)ppFVar1 | 0x20;
            }
          }
          uVar14 = uVar14 + 1;
          if (9999 < uVar14) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                               ,0x380,"(++counter < 10000)",
                               "We should not be looping this many times!");
            if (!bVar9) goto LAB_006265cb;
            *puVar10 = 0;
          }
          pLVar5 = (LabelInstr *)instr[1].m_next;
          if (pLVar5 == (LabelInstr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                               ,900,"(reTargetLabel)","reTargetLabel");
            if (!bVar9) goto LAB_006265cb;
            *puVar10 = 0;
          }
          if (targetInstr == pLVar5) {
            bVar9 = false;
          }
          else {
            pLVar7 = branchInstr->m_branchTarget;
            if (pLVar7 == (LabelInstr *)0x0) {
              if (branchInstr->m_isMultiBranch == false) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar10 = 1;
                uVar13 = 0x20e;
                pcVar12 = "(m_isMultiBranch)";
                pcVar11 = "m_isMultiBranch";
                goto LAB_006264b9;
              }
            }
            else if (branchInstr->m_isMultiBranch == true) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              uVar13 = 0x209;
              pcVar12 = "(!m_isMultiBranch)";
              pcVar11 = "!m_isMultiBranch";
LAB_006264b9:
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,uVar13,pcVar12,pcVar11);
              if (!bVar9) goto LAB_006265cb;
              *puVar10 = 0;
            }
            if (pLVar7 == (LabelInstr *)0x0) {
              branchRef = IR::BranchInstr::AsMultiBrInstr(branchInstr);
              if (targetInstr != (LabelInstr *)0x0) {
                IR::LabelInstr::RemoveLabelRef(targetInstr,&branchRef->super_BranchInstr);
              }
              if (pLVar5 != (LabelInstr *)0x0) {
                IR::LabelInstr::AddLabelRef(pLVar5,&branchRef->super_BranchInstr);
              }
            }
            else {
              if (branchInstr->m_isMultiBranch == true) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar10 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                   ,0x1d3,"(!this->m_isMultiBranch)","!this->m_isMultiBranch");
                if (!bVar9) goto LAB_006265cb;
                *puVar10 = 0;
              }
              if (branchInstr->m_branchTarget != (LabelInstr *)0x0) {
                IR::LabelInstr::RemoveLabelRef(branchInstr->m_branchTarget,branchInstr);
              }
              if (pLVar5 != (LabelInstr *)0x0) {
                IR::LabelInstr::AddLabelRef(pLVar5,branchInstr);
              }
              branchInstr->m_branchTarget = pLVar5;
            }
            if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
                 (targetInstr->labelRefs).
                 super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                 super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                 super_SListNodeBase<Memory::ArenaAllocator>.next == &targetInstr->labelRefs) &&
               ((targetInstr->field_0x78 & 4) == 0)) {
              PeepUnreachableLabel(targetInstr,false,(bool *)0x0);
            }
            instr = IR::Instr::GetNextRealInstr((Instr *)pLVar5);
            bVar9 = true;
            targetInstr = pLVar5;
          }
        }
      }
      else {
LAB_0062626a:
        bVar9 = false;
      }
    } while (bVar9);
  }
  return targetInstr;
}

Assistant:

IR::LabelInstr *
Peeps::RetargetBrToBr(IR::BranchInstr *branchInstr, IR::LabelInstr * targetInstr)
{
    AnalysisAssert(targetInstr);
    IR::Instr *targetInstrNext = targetInstr->GetNextRealInstr();
    AnalysisAssertMsg(targetInstrNext, "GetNextRealInstr() failed to get next target");

    // Removing branch to branch breaks some lexical assumptions about loop in sccliveness/linearscan/second chance.
    if (!branchInstr->IsLowered())
    {
        return targetInstr;
    }

    //
    // Retarget branch-to-branch
    //
#if DBG
    uint counter = 0;
#endif

    IR::LabelInstr *lastLoopTop = NULL;

    while (true)
    {
        // There's very few cases where we can safely follow a branch chain with intervening instrs.
        // One of them, which comes up occasionally, is where there is a copy of a single-def symbol
        // to another single-def symbol which is only used for the branch instruction (i.e. one dead
        // after the branch). Another is where a single-def symbol is declared of a constant (e.g. a
        // symbol created to store "True"
        // Unfortuantely, to properly do this, we'd need to do it somewhere else (i.e. not in peeps)
        // and make use of the additional information that we'd have there. Having the flow graph or
        // just any more information about variable liveness is necessary to determine that the load
        // instructions between jumps can be safely skipped.
        // The general case where this would be useful, on a higher level, is where a long statement
        // containing many branches returns a value; the branching here can put the result into some
        // different stacksym at each level, meaning that there'd be a load between each branch. The
        // result is that we don't currently optimize it.
        IR::BranchInstr *branchAtTarget = nullptr;
        if (targetInstrNext->IsBranchInstr())
        {
            branchAtTarget = targetInstrNext->AsBranchInstr();
        }
        else
        {
            // We don't have the information here to decide whether or not to continue the branch chain.
            break;
        }
        // This used to just be a targetInstrNext->AsBranchInstr()->IsUnconditional(), but, in order
        // to optimize further, it became necessary to handle more than just unconditional jumps. In
        // order to keep the code relatively clean, the "is it an inherently-taken jump chain" check
        // code now follows here:
        if (!targetInstrNext->AsBranchInstr()->IsUnconditional())
        {
            bool safetofollow = false;
            if(targetInstrNext->m_opcode == branchInstr->m_opcode)
            {
                // If it's the same branch instruction, with the same arguments, the branch decision should,
                // similarly, be the same. There's a bit more that can be done with this (e.g. for inverted,
                // but otherwise similar instructions like brTrue and brFalse, the destination could go down
                // the other path), but this is something that should probably be done more generally, so we
                // can optimize branch chains that have other interesting bechaviors.
                if (
                    (
                        (branchInstr->GetSrc1() && targetInstrNext->GetSrc1() && branchInstr->GetSrc1()->IsEqual(targetInstrNext->GetSrc1())) ||
                        !(branchInstr->GetSrc1() || targetInstrNext->GetSrc1())
                    ) && (
                        (branchInstr->GetSrc2() && targetInstrNext->GetSrc2() && branchInstr->GetSrc2()->IsEqual(targetInstrNext->GetSrc2())) ||
                        !(branchInstr->GetSrc2() || targetInstrNext->GetSrc2())
                    )
                   )
                {
                    safetofollow = true;
                }
            }
            if (!safetofollow)
            {
                // We can't say safely that this branch is something that we can implicitly take, so instead
                // cut off the branch chain optimization here.
                break;
            }
        }

        // We don't want to skip the loop entry, unless we're right before the encoder
        if (targetInstr->m_isLoopTop && !branchAtTarget->IsLowered())
        {
            break;
        }

        if (targetInstr->m_isLoopTop)
        {
            if (targetInstr == lastLoopTop)
            {
                // We are back to a loopTop already visited.
                // Looks like an infinite loop somewhere...
                break;
            }
            lastLoopTop = targetInstr;
        }
#if DBG
        if (!branchInstr->IsMultiBranch() && branchInstr->GetTarget()->m_noHelperAssert && !branchAtTarget->IsMultiBranch())
        {
            branchAtTarget->GetTarget()->m_noHelperAssert = true;
        }

        AssertMsg(++counter < 10000, "We should not be looping this many times!");
#endif

        IR::LabelInstr * reTargetLabel = branchAtTarget->GetTarget();
        AnalysisAssert(reTargetLabel);
        if (targetInstr == reTargetLabel)
        {
            // Infinite loop.
            //    JCC $L1
            // L1:
            //    JMP $L1
            break;
        }

        if(branchInstr->IsMultiBranch())
        {
            IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();
            multiBranchInstr->ChangeLabelRef(targetInstr, reTargetLabel);
        }
        else
        {
            branchInstr->SetTarget(reTargetLabel);
        }

        if (targetInstr->IsUnreferenced())
        {
            Peeps::PeepUnreachableLabel(targetInstr, false);
        }

        targetInstr = reTargetLabel;
        targetInstrNext = targetInstr->GetNextRealInstr();
    }
    return targetInstr;
}